

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * __thiscall
RPCArg::ToStringObj_abi_cxx11_(string *__return_storage_ptr__,RPCArg *this,bool oneline)

{
  long lVar1;
  pointer pRVar2;
  string_view func;
  string_view func_00;
  NonFatalCheckError *this_00;
  char *pcVar3;
  pointer this_01;
  long in_FS_OFFSET;
  string_view msg;
  string_view msg_00;
  string_view file;
  string_view file_00;
  string local_98;
  string local_78;
  string res;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  res._M_dataplus._M_p = (pointer)&res.field_2;
  res._M_string_length = 0;
  res.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(&res,"\"")
  ;
  GetFirstName_abi_cxx11_(&local_78,this);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&res,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  pcVar3 = "\": ";
  if (oneline) {
    pcVar3 = "\":";
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&res,pcVar3);
  pcVar3 = "\"str\"";
  switch(this->m_type) {
  case OBJ:
  case OBJ_NAMED_PARAMS:
  case OBJ_USER_KEYS:
    this_00 = (NonFatalCheckError *)__cxa_allocate_exception(0x10);
    func._M_str = "ToStringObj";
    func._M_len = 0xb;
    msg._M_str = "Unreachable code reached (non-fatal)";
    msg._M_len = 0x24;
    file._M_str = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/util.cpp";
    file._M_len = 0x5c;
    NonFatalCheckError::NonFatalCheckError(this_00,msg,file,0x4e1,func);
    goto LAB_005a6f78;
  case ARR:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&res,"[");
    pRVar2 = (this->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_01 = (this->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                   super__Vector_impl_data._M_start; this_01 != pRVar2; this_01 = this_01 + 1) {
      ToString_abi_cxx11_(&local_98,this_01,oneline);
      std::operator+(&local_78,&local_98,",");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&res,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
    }
    pcVar3 = "...]";
    break;
  case STR:
    break;
  case NUM:
    pcVar3 = "n";
    break;
  case BOOL:
    pcVar3 = "bool";
    break;
  case AMOUNT:
    pcVar3 = "amount";
    break;
  case STR_HEX:
    pcVar3 = "\"hex\"";
    break;
  case RANGE:
    pcVar3 = "n or [n,n]";
    break;
  default:
    this_00 = (NonFatalCheckError *)__cxa_allocate_exception(0x10);
    func_00._M_str = "ToStringObj";
    func_00._M_len = 0xb;
    msg_00._M_str = "Unreachable code reached (non-fatal)";
    msg_00._M_len = 0x24;
    file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/util.cpp"
    ;
    file_00._M_len = 0x5c;
    NonFatalCheckError::NonFatalCheckError(this_00,msg_00,file_00,0x4e3,func_00);
LAB_005a6f78:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&NonFatalCheckError::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_005a702b;
  }
  std::operator+(__return_storage_ptr__,&res,pcVar3);
  std::__cxx11::string::~string((string *)&res);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
LAB_005a702b:
  __stack_chk_fail();
}

Assistant:

std::string RPCArg::ToStringObj(const bool oneline) const
{
    std::string res;
    res += "\"";
    res += GetFirstName();
    if (oneline) {
        res += "\":";
    } else {
        res += "\": ";
    }
    switch (m_type) {
    case Type::STR:
        return res + "\"str\"";
    case Type::STR_HEX:
        return res + "\"hex\"";
    case Type::NUM:
        return res + "n";
    case Type::RANGE:
        return res + "n or [n,n]";
    case Type::AMOUNT:
        return res + "amount";
    case Type::BOOL:
        return res + "bool";
    case Type::ARR:
        res += "[";
        for (const auto& i : m_inner) {
            res += i.ToString(oneline) + ",";
        }
        return res + "...]";
    case Type::OBJ:
    case Type::OBJ_NAMED_PARAMS:
    case Type::OBJ_USER_KEYS:
        // Currently unused, so avoid writing dead code
        NONFATAL_UNREACHABLE();
    } // no default case, so the compiler can warn about missing cases
    NONFATAL_UNREACHABLE();
}